

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O3

void cf_aes_decrypt(cf_aes_context *ctx,uint8_t *in,uint8_t *out)

{
  uint uVar1;
  uint32_t *puVar2;
  uint32_t uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t *puVar9;
  uint uVar10;
  undefined8 local_48;
  uint32_t local_40;
  uint32_t local_3c;
  uint8_t *local_38;
  
  uVar6 = ctx->rounds;
  uVar4 = (ulong)uVar6;
  local_38 = out;
  if ((uVar4 < 0xf) && ((0x5400U >> (uVar6 & 0x1f) & 1) != 0)) {
    uVar7 = *(uint *)in;
    uVar8 = *(uint *)(in + 4);
    uVar10 = *(uint *)(in + 8);
    uVar1 = *(uint *)(in + 0xc);
    local_48 = CONCAT44((uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                        uVar8 << 0x18) ^ ctx->ks[uVar4 * 4 + 1],
                        (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                        uVar7 << 0x18) ^ ctx->ks[uVar4 * 4]);
    local_40 = (uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18)
               ^ ctx->ks[uVar4 * 4 + 2];
    local_3c = (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) ^
               ctx->ks[uVar4 * 4 + 3];
    iVar5 = uVar6 - 1;
    puVar2 = ctx->ks + uVar4 * 4 + -4;
    do {
      puVar9 = puVar2;
      inv_shift_rows((uint32_t *)&local_48);
      inv_sub_block((uint32_t *)&local_48);
      uVar7 = (uint)local_48 ^ *puVar9;
      uVar6 = local_48._4_4_ ^ puVar9[1];
      uVar10 = local_40 ^ puVar9[2];
      uVar8 = local_3c ^ puVar9[3];
      local_40 = uVar10;
      local_48._0_4_ = uVar7;
      local_48._4_4_ = uVar6;
      uVar3 = inv_mix_column(uVar7);
      local_48 = CONCAT44(local_48._4_4_,uVar3);
      uVar3 = inv_mix_column(uVar6);
      local_48 = CONCAT44(uVar3,(uint)local_48);
      local_40 = inv_mix_column(uVar10);
      local_3c = inv_mix_column(uVar8);
      iVar5 = iVar5 + -1;
      puVar2 = puVar9 + -4;
    } while (iVar5 != 0);
    inv_shift_rows((uint32_t *)&local_48);
    inv_sub_block((uint32_t *)&local_48);
    local_48 = local_48 ^ *(ulong *)(puVar9 + -4);
    local_40 = local_40 ^ (uint)*(ulong *)(puVar9 + -2);
    uVar6 = local_3c ^ ((cf_aes_context *)(puVar9 + -1))->rounds;
    *local_38 = (uint8_t)(local_48 >> 0x18);
    local_38[1] = (uint8_t)(local_48 >> 0x10);
    local_38[2] = (uint8_t)(local_48 >> 8);
    local_38[3] = (uint8_t)local_48;
    local_38[4] = (uint8_t)(local_48 >> 0x38);
    local_38[5] = (uint8_t)(local_48 >> 0x30);
    local_38[6] = (uint8_t)(local_48 >> 0x28);
    local_38[7] = (uint8_t)(local_48 >> 0x20);
    local_38[8] = (uint8_t)(local_40 >> 0x18);
    local_38[9] = (uint8_t)(local_40 >> 0x10);
    local_38[10] = (uint8_t)(local_40 >> 8);
    local_38[0xb] = (uint8_t)local_40;
    local_38[0xc] = (uint8_t)(uVar6 >> 0x18);
    local_38[0xd] = (uint8_t)(uVar6 >> 0x10);
    local_38[0xe] = (uint8_t)(uVar6 >> 8);
    local_38[0xf] = (uint8_t)uVar6;
    return;
  }
  abort();
}

Assistant:

void cf_aes_decrypt(const cf_aes_context *ctx,
                    const uint8_t in[AES_BLOCKSZ],
                    uint8_t out[AES_BLOCKSZ])
{
  assert(ctx->rounds == AES128_ROUNDS ||
         ctx->rounds == AES192_ROUNDS ||
         ctx->rounds == AES256_ROUNDS);

  uint32_t state[4] = {
    read32_be(in + 0),
    read32_be(in + 4),
    read32_be(in + 8),
    read32_be(in + 12)
  };

  const uint32_t *round_keys = &ctx->ks[ctx->rounds << 2];
  add_round_key(state, round_keys);
  round_keys -= 4;

  for (uint32_t round = ctx->rounds - 1; round != 0; round--)
  {
    inv_shift_rows(state);
    inv_sub_block(state);
    add_round_key(state, round_keys);
    inv_mix_columns(state);
    round_keys -= 4;
  }

  inv_shift_rows(state);
  inv_sub_block(state);
  add_round_key(state, round_keys);
  
  write32_be(state[0], out + 0);
  write32_be(state[1], out + 4);
  write32_be(state[2], out + 8);
  write32_be(state[3], out + 12);
}